

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_entity.cxx
# Opt level: O0

void __thiscall
xray_re::cse_alife_creature_abstract::state_read
          (cse_alife_creature_abstract *this,xr_packet *packet,uint16_t size)

{
  uint32_t uVar1;
  uint16_t size_local;
  xr_packet *packet_local;
  cse_alife_creature_abstract *this_local;
  
  cse_alife_dynamic_object_visual::state_read((cse_alife_dynamic_object_visual *)this,packet,size);
  xr_packet::r_u8(packet,&this->m_s_team);
  xr_packet::r_u8(packet,&this->m_s_squad);
  xr_packet::r_u8(packet,&this->m_s_group);
  if (0x12 < *(ushort *)&this->field_0x28) {
    xr_packet::r_float(packet,&this->m_health);
  }
  if (*(ushort *)&this->field_0x28 < 0x73) {
    this->m_health = this->m_health * 0.01;
  }
  if (*(ushort *)&this->field_0x28 < 0x20) {
    cse_visual::visual_read((cse_visual *)&this->field_0x118,packet,*(uint16_t *)&this->field_0x28);
  }
  if (0x57 < *(ushort *)&this->field_0x28) {
    uVar1 = xr_packet::r_u32(packet);
    xr_packet::r_seq<std::vector<unsigned_short,std::allocator<unsigned_short>>>
              (packet,(ulong)uVar1,&this->m_dynamic_out_restrictions);
    uVar1 = xr_packet::r_u32(packet);
    xr_packet::r_seq<std::vector<unsigned_short,std::allocator<unsigned_short>>>
              (packet,(ulong)uVar1,&this->m_dynamic_in_restrictions);
  }
  if (0x5e < *(ushort *)&this->field_0x28) {
    xr_packet::r_u16(packet,&this->m_killer_id);
  }
  (this->m_o_torso).yaw = *(float *)&this->field_0x70;
  (this->m_o_torso).pitch = *(float *)&this->field_0x6c;
  if (0x73 < *(ushort *)&this->field_0x28) {
    xr_packet::r_u64(packet,&this->m_game_death_time);
  }
  return;
}

Assistant:

void cse_alife_creature_abstract::state_read(xr_packet& packet, uint16_t size)
{
	cse_alife_dynamic_object_visual::state_read(packet, size);
	packet.r_u8(m_s_team);
	packet.r_u8(m_s_squad);
	packet.r_u8(m_s_group);
	if (m_version > CSE_VERSION_0x12)
		packet.r_float(m_health);
	if (m_version < CSE_VERSION_0x73)
		m_health *= 0.01f;
	if (m_version < CSE_VERSION_0x20)
		cse_visual::visual_read(packet, m_version);
	if (m_version > CSE_VERSION_0x57) {
		packet.r_seq(packet.r_u32(), m_dynamic_out_restrictions);
		packet.r_seq(packet.r_u32(), m_dynamic_in_restrictions);
	}
	if (m_version > CSE_VERSION_0x5e)
		packet.r_u16(m_killer_id);
	m_o_torso.yaw = m_o_angle.y;
	m_o_torso.pitch = m_o_angle.x;
	if (m_version > CSE_VERSION_0x73)
		packet.r_u64(m_game_death_time);
}